

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEditor.cc
# Opt level: O0

void __thiscall
GraphEditorNodeDeletion::GraphEditorNodeDeletion
          (GraphEditorNodeDeletion *this,sgNodeID_t node,
          vector<long,_std::allocator<long>_> *connected_ends)

{
  GraphEditorOperation *in_RDI;
  vector<long,_std::allocator<long>_> *in_stack_00000068;
  vector<long,_std::allocator<long>_> *in_stack_00000070;
  long *in_stack_ffffffffffffffd8;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffffe0;
  
  GraphEditorOperation::GraphEditorOperation(in_RDI);
  std::vector<long,std::allocator<long>>::emplace_back<long&>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<long,_std::allocator<long>_>::operator=(in_stack_00000070,in_stack_00000068);
  std::vector<long,_std::allocator<long>_>::operator=(in_stack_00000070,in_stack_00000068);
  return;
}

Assistant:

GraphEditorNodeDeletion::GraphEditorNodeDeletion(sgNodeID_t node, const std::vector<sgNodeID_t> &connected_ends){
    input_nodes.emplace_back(node);
    consumed_nodes=input_nodes;
    consumed_ends=connected_ends;
}